

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

_Bool borg_flow_kill_aim(_Bool viewable)

{
  loc grid1;
  int iVar1;
  int iVar2;
  _Bool _Var3;
  wchar_t wVar4;
  int local_20;
  wchar_t i;
  wchar_t s_c_x;
  wchar_t s_c_y;
  wchar_t o_x;
  wchar_t o_y;
  _Bool viewable_local;
  
  iVar2 = borg.c.y;
  iVar1 = borg.c.x;
  borg.c.x = iVar1;
  borg.c.y = iVar2;
  if (((((borg_kills_cnt != 0) && (borg.time_this_panel < 0x1f5)) && (borg.trait[0x6d] == 0)) &&
      ((borg.trait[0x6c] == 0 && (borg.trait[0x27] != 0)))) &&
     (_Var3 = borg_has_distance_attack(), !_Var3)) {
    for (s_c_x = L'\xfffffffe'; borg.c.x = iVar1, borg.c.y = iVar2, s_c_x < L'\x03';
        s_c_x = s_c_x + L'\x01') {
      for (s_c_y = L'\xfffffffe'; s_c_y < L'\x03'; s_c_y = s_c_y + L'\x01') {
        if ((s_c_x != L'\0') || (s_c_y != L'\0')) {
          borg.c.x = iVar1 + s_c_x;
          borg.c.y = iVar2 + s_c_y;
          if ((borg.c.x < 0xc5) && (((1 < borg.c.x && (borg.c.y < 0x41)) && (1 < borg.c.y)))) {
            local_20 = 0;
            while ((local_20 < borg_kills_nxt &&
                   (grid1.y = borg.c.y, grid1.x = borg.c.x,
                   wVar4 = distance(grid1,borg_kills[local_20].pos), wVar4 != L'\x01'))) {
              local_20 = local_20 + 1;
            }
            if ((local_20 == borg_kills_nxt) && (_Var3 = borg_has_distance_attack(), _Var3)) {
              borg_flow_clear();
              borg_flow_enqueue_grid(borg.c.y,borg.c.x);
              borg.c.x = iVar1;
              borg.c.y = iVar2;
              borg_flow_spread(L'\x05',true,(_Bool)((viewable ^ 0xffU) & 1),false,L'\xffffffff',
                               false);
              _Var3 = borg_flow_commit("targetable position",L'\x01');
              if (!_Var3) {
                return false;
              }
              _Var3 = borg_flow_old(L'\x01');
              if (_Var3) {
                return true;
              }
              return false;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_kill_aim(bool viewable)
{
    int o_y, o_x;
    int s_c_y = borg.c.y;
    int s_c_x = borg.c.x;
    int i;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Sometimes we loop on this if we back  up to a point where */
    /* the monster is out of site */
    if (borg.time_this_panel > 500)
        return false;

    /* Not if Weak from hunger or no food */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]
        || borg.trait[BI_FOOD] == 0)
        return false;

    /* If you can shoot from where you are, don't bother reaiming */
    if (borg_has_distance_attack())
        return false;

    /* Consider each adjacent spot */
    for (o_x = -2; o_x <= 2; o_x++) {
        for (o_y = -2; o_y <= 2; o_y++) {
            /* borg_attack would have already checked
               for a shot from where I currently am */
            if (o_x == 0 && o_y == 0)
                continue;

            /* XXX  Mess with where the program thinks the
               player is */
            borg.c.x = s_c_x + o_x;
            borg.c.y = s_c_y + o_y;

            /* avoid screen edges */
            if (borg.c.x > AUTO_MAX_X - 2 || borg.c.x < 2
                || borg.c.y > AUTO_MAX_Y - 2 || borg.c.y < 2)
                continue;

            /* Make sure we do not end up next to a monster */
            for (i = 0; i < borg_kills_nxt; i++) {
                if (distance(borg.c, borg_kills[i].pos) == 1)
                    break;
            }
            if (i != borg_kills_nxt)
                continue;

            /* Check for a distance attack from here */
            if (borg_has_distance_attack()) {
                /* Clear the flow codes */
                borg_flow_clear();

                /* Enqueue the grid */
                borg_flow_enqueue_grid(borg.c.y, borg.c.x);

                /* restore the saved player position */
                borg.c.x = s_c_x;
                borg.c.y = s_c_y;

                /* Spread the flow */
                borg_flow_spread(5, true, !viewable, false, -1, false);

                /* Attempt to Commit the flow */
                if (!borg_flow_commit("targetable position", GOAL_KILL))
                    return false;

                /* Take one step */
                if (!borg_flow_old(GOAL_KILL))
                    return false;

                return true;
            }
        }
    }

    /* restore the saved player position */
    borg.c.x = s_c_x;
    borg.c.y = s_c_y;

    return false;
}